

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-sig-verifier.c
# Opt level: O1

void ndn_sig_verifier_after_bootstrapping(ndn_face_intf_t *face)

{
  ndn_key_storage_t *pnVar1;
  ndn_key_storage_t *__src;
  long lVar2;
  undefined1 local_1ec [8];
  ndn_name_t prefix;
  
  lVar2 = -0x84;
  m_sig_verifier_state.face = face;
  pnVar1 = ndn_key_storage_get_instance();
  __src = pnVar1;
  do {
    if (*(int *)(pnVar1->self_cert[0].name.components[0].value + lVar2 + 0x20) != -1) {
      memcpy((ndn_name_t *)local_1ec,__src,0x1bc);
      printf("DEBUG: %s, L%d: ","ndn_sig_verifier_after_bootstrapping",0x98);
      printf("[SIGVERIFIER] SigVerifier register prefix for: ");
      ndn_name_print((ndn_name_t *)local_1ec);
      ndn_forwarder_register_name_prefix
                ((ndn_name_t *)local_1ec,sig_verifier_on_interest,(void *)0x0);
    }
    __src = (ndn_key_storage_t *)(__src->self_identity + 1);
    lVar2 = lVar2 + 0x2c;
  } while (lVar2 != 0);
  return;
}

Assistant:

void
ndn_sig_verifier_after_bootstrapping(ndn_face_intf_t* face)
{
  m_sig_verifier_state.face = face;
  ndn_name_t prefix;
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  for (int i = 0; i < NDN_SEC_CERT_SIZE; i++) {
    if (storage->self_identity_key[i].key_id != NDN_SEC_INVALID_KEY_ID) {
      memcpy(&prefix, &storage->self_identity[i], sizeof(ndn_name_t));
      NDN_LOG_DEBUG("[SIGVERIFIER] SigVerifier register prefix for: ");
      NDN_LOG_DEBUG_NAME(&prefix);
      ndn_forwarder_register_name_prefix(&prefix, sig_verifier_on_interest, NULL);
    }
  }
}